

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Condition.cpp
# Opt level: O0

void __thiscall
Condition::Condition
          (Condition *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *condition)

{
  MathInterpreter *this_00;
  DataBase *this_01;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Variable_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Variable_*>_>_>
  *data;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *condition_local;
  Condition *this_local;
  
  Expression::Expression(&this->super_Expression);
  (this->super_Expression)._vptr_Expression = (_func_int **)&PTR_calculate_0012dcf8;
  this->m = (MathInterpreter *)0x0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&this->m_condition);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=(&this->m_condition,condition);
  this_00 = (MathInterpreter *)operator_new(0x20);
  this_01 = DataBase::getInstance();
  data = DataBase::getInVarMap_abi_cxx11_(this_01);
  MathInterpreter::MathInterpreter(this_00,data);
  this->m = this_00;
  return;
}

Assistant:

Condition::Condition(vector<string> condition) {
  this->m_condition = condition;
  this->m = new MathInterpreter(DataBase::getInstance()->getInVarMap());
}